

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

CompoundStmt * __thiscall Parser::compound_statement(Parser *this)

{
  TokenKind TVar1;
  Stmt *s;
  CompoundStmt *local_20;
  Stmt *local_18;
  
  std::make_unique<CompoundStmt>();
  if ((this->tok->kind != Punctuator) || (this->tok->i != 0x7b)) {
    error<char_const(&)[31]>(this,(char (*) [31])"expecting \'{\' to start a block");
  }
  next_token(this);
  do {
    TVar1 = this->tok->kind;
    if (TVar1 == Punctuator) {
      if (this->tok->i == 0x7d) {
        return local_20;
      }
    }
    else if (TVar1 == Eof) {
      error<char_const(&)[25]>(this,(char (*) [25])"expecting \'}\' before EOF");
LAB_0010ce45:
      if (local_20 != (CompoundStmt *)0x0) {
        (*(local_20->super_Stmt).super_Node._vptr_Node[1])();
      }
      return (CompoundStmt *)0x0;
    }
    local_18 = statement(this);
    if (local_18 == (Stmt *)0x0) goto LAB_0010ce45;
    std::vector<Stmt_*,_std::allocator<Stmt_*>_>::push_back(&local_20->stmts,&local_18);
  } while( true );
}

Assistant:

CompoundStmt* Parser::compound_statement()
{
  auto b = std::make_unique<CompoundStmt>();

  if (!is_punctuator('{'))
    error("expecting '{' to start a block");

  next_token();                 // Skip '{'

  while (tok->kind != TokenKind::Eof) {
    if (is_punctuator('}')) {
      return b.release();
    }
    else {
      auto s = statement();
      if (s)
        b->stmts.push_back(s);
      else
        return nullptr;
    }
  }

  error("expecting '}' before EOF");
  return nullptr;
}